

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profit.c
# Opt level: O0

bool_t prf_openflight_check_file(char *filename)

{
  size_t sVar1;
  char *in_RDI;
  int tmp;
  char magic [2];
  FILE *fp;
  char local_1a;
  char local_19;
  FILE *local_18;
  bool_t local_4;
  
  local_18 = fopen(in_RDI,"rb");
  if (local_18 == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    sVar1 = fread(&local_1a,1,2,local_18);
    fclose(local_18);
    if ((((int)sVar1 == 2) && (local_1a == '\0')) && (local_19 == '\x01')) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

bool_t
prf_openflight_check_file(
    const char * filename )
{
    FILE * fp;
    char magic[2];
    int tmp;
    if ( (fp = fopen( filename, "rb" )) == NULL ) return FALSE;
    tmp = fread( magic, 1, 2, fp );
    fclose( fp );
    if ( tmp != 2 || magic[0] != 0 || magic[1] != 1 ) return FALSE;
    return TRUE;
}